

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O3

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   *B)

{
  mapped_type *pmVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer ppVar4;
  ulong uVar5;
  key_type local_3c;
  mapped_type local_38;
  
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize(B,((long)(A->
                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(A->
                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pfVar2 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pfVar3 != pfVar2) {
    uVar5 = 0;
    do {
      if (pfVar2[uVar5].m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
        ppVar4 = pfVar2[uVar5].m_flat_tree.m_data.m_seq.m_holder.m_start;
        do {
          local_38 = ppVar4->second;
          local_3c = (key_type)uVar5;
          pmVar1 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
                   priv_subscript((B->
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + ppVar4->first,
                                  &local_3c);
          *pmVar1 = local_38;
          ppVar4 = ppVar4 + 1;
          pfVar2 = (A->
                   super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (ppVar4 != pfVar2[uVar5].m_flat_tree.m_data.m_seq.m_holder.m_start +
                           pfVar2[uVar5].m_flat_tree.m_data.m_seq.m_holder.m_size);
        pfVar3 = (A->
                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)pfVar3 - (long)pfVar2 >> 3) * -0x5555555555555555));
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}